

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int regNewData,int *aRegIdx,
               int update_flags,int appendBias,int useSeekResult)

{
  ushort uVar1;
  int p1;
  int iVar2;
  Vdbe *p;
  byte local_78;
  uint local_74;
  int local_48;
  byte local_41;
  int i;
  u8 pik_flags;
  Index *pIdx;
  Vdbe *v;
  int *aRegIdx_local;
  int regNewData_local;
  int iIdxCur_local;
  int iDataCur_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  local_48 = 0;
  for (_i = pTab->pIndex; local_78 = (byte)update_flags, _i != (Index *)0x0; _i = _i->pNext) {
    if (aRegIdx[local_48] != 0) {
      if (_i->pPartIdxWhere != (Expr *)0x0) {
        p1 = aRegIdx[local_48];
        iVar2 = sqlite3VdbeCurrentAddr(p);
        sqlite3VdbeAddOp2(p,0x32,p1,iVar2 + 2);
      }
      local_41 = 0;
      if (useSeekResult != 0) {
        local_41 = 0x10;
      }
      if (((*(ushort *)&_i->field_0x63 & 3) == 2) && ((pTab->tabFlags & 0x20) != 0)) {
        local_41 = local_41 | 1 | local_78 & 2;
      }
      if ((*(ushort *)&_i->field_0x63 >> 3 & 1) == 0) {
        uVar1 = _i->nColumn;
      }
      else {
        uVar1 = _i->nKeyCol;
      }
      local_74 = (uint)uVar1;
      sqlite3VdbeAddOp4Int
                (p,0x84,iIdxCur + local_48,aRegIdx[local_48],aRegIdx[local_48] + 1,local_74);
      sqlite3VdbeChangeP5(p,(ushort)local_41);
    }
    local_48 = local_48 + 1;
  }
  if ((pTab->tabFlags & 0x20) == 0) {
    if (pParse->nested == '\0') {
      if (update_flags == 0) {
        local_78 = 0x20;
      }
      local_41 = local_78 | 1;
    }
    else {
      local_41 = 0;
    }
    if (appendBias != 0) {
      local_41 = local_41 | 8;
    }
    if (useSeekResult != 0) {
      local_41 = local_41 | 0x10;
    }
    sqlite3VdbeAddOp3(p,0x7a,iDataCur,aRegIdx[local_48],regNewData);
    if (pParse->nested == '\0') {
      sqlite3VdbeAppendP4(p,pTab,-6);
    }
    sqlite3VdbeChangeP5(p,(ushort)local_41);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int iDataCur,       /* Cursor of the canonical data source */
  int iIdxCur,        /* First index cursor */
  int regNewData,     /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int update_flags,   /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  Vdbe *v;            /* Prepared statements under construction */
  Index *pIdx;        /* An index being inserted or updated */
  u8 pik_flags;       /* flag values passed to the btree insert */
  int i;              /* Loop counter */

  assert( update_flags==0
       || update_flags==OPFLAG_ISUPDATE
       || update_flags==(OPFLAG_ISUPDATE|OPFLAG_SAVEPOSITION)
  );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    if( aRegIdx[i]==0 ) continue;
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_IsNull, aRegIdx[i], sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
    }
    pik_flags = (useSeekResult ? OPFLAG_USESEEKRESULT : 0);
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      assert( pParse->nested==0 );
      pik_flags |= OPFLAG_NCHANGE;
      pik_flags |= (update_flags & OPFLAG_SAVEPOSITION);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      if( update_flags==0 ){
        int r = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, r);
        sqlite3VdbeAddOp4(v, OP_Insert, 
            iIdxCur+i, aRegIdx[i], r, (char*)pTab, P4_TABLE
        );
        sqlite3VdbeChangeP5(v, OPFLAG_ISNOOP);
        sqlite3ReleaseTempReg(pParse, r);
      }
#endif
    }
    sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iIdxCur+i, aRegIdx[i],
                         aRegIdx[i]+1,
                         pIdx->uniqNotNull ? pIdx->nKeyCol: pIdx->nColumn);
    sqlite3VdbeChangeP5(v, pik_flags);
  }
  if( !HasRowid(pTab) ) return;
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (update_flags?update_flags:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, iDataCur, aRegIdx[i], regNewData);
  if( !pParse->nested ){
    sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}